

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall
IF97::Region3Backwards::Region3RegionDivision::T_p(Region3RegionDivision *this,double p)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  double dVar4;
  ulong local_30;
  size_t i;
  double summer;
  double pi;
  double p_local;
  Region3RegionDivision *this_local;
  
  i = 0;
  for (local_30 = 0; local_30 < this->N; local_30 = local_30 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->n,local_30);
    dVar1 = *pvVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->I,local_30);
    dVar4 = powi(p / 1.0,*pvVar3);
    i = (size_t)(dVar1 * dVar4 + (double)i);
  }
  return (double)i * 1.0;
}

Assistant:

virtual double T_p(double p){
                const double pi = p/(1.0*p_fact);
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*powi(pi, I[i]);
                }
                return summer*1.0;  // sum is multiplied by T* = 1.0 [K]
            }